

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O2

REF_STATUS
ref_recon_signed_hessian
          (REF_GRID ref_grid,REF_DBL *scalar,REF_DBL *hessian,REF_RECON_RECONSTRUCTION recon)

{
  int *piVar1;
  size_t __size;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  int iVar5;
  REF_NODE pRVar6;
  REF_CELL pRVar7;
  REF_ADJ pRVar8;
  long lVar9;
  double dVar10;
  uint uVar11;
  REF_DBL *grad;
  long lVar12;
  REF_DBL *scalar_00;
  ulong uVar13;
  REF_DBL *grad_00;
  REF_DBL *grad_01;
  REF_DBL *grad_02;
  long lVar14;
  REF_BOOL *replace;
  void *__ptr;
  ulong uVar15;
  REF_DBL *pRVar16;
  undefined8 uVar17;
  REF_BOOL *pRVar18;
  void *pvVar19;
  char *pcVar20;
  long lVar21;
  REF_NODE ref_node;
  ulong uStack_70;
  REF_EDGE local_38;
  
  if (recon == REF_RECON_KEXACT) {
    uVar11 = ref_recon_kexact_gradient_hessian(ref_grid,scalar,(REF_DBL *)0x0,hessian);
    if (uVar11 == 0) {
      return 0;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x599,
           "ref_recon_signed_hessian",(ulong)uVar11,"k-exact");
    return uVar11;
  }
  if (recon != REF_RECON_L2PROJECTION) {
    pcVar20 = "reconstruction not available";
    uVar17 = 0x59d;
LAB_001e2eea:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar17,
           "ref_recon_signed_hessian",pcVar20);
    return 1;
  }
  pRVar6 = ref_grid->node;
  uVar15 = (ulong)(uint)pRVar6->max;
  if (pRVar6->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x17e,
           "ref_recon_l2_projection_hessian","malloc grad of REF_DBL negative");
    uStack_70 = 1;
  }
  else {
    lVar14 = uVar15 * 3;
    __size = uVar15 * 0x18;
    grad = (REF_DBL *)malloc(__size);
    if (grad == (REF_DBL *)0x0) {
      pcVar20 = "malloc grad of REF_DBL NULL";
      uVar17 = 0x17e;
    }
    else {
      for (lVar12 = 0; lVar14 != lVar12; lVar12 = lVar12 + 1) {
        grad[lVar12] = 0.0;
      }
      scalar_00 = (REF_DBL *)malloc(uVar15 * 8);
      if (scalar_00 == (REF_DBL *)0x0) {
        pcVar20 = "malloc dsdx of REF_DBL NULL";
        uVar17 = 0x17f;
      }
      else {
        for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
          scalar_00[uVar13] = 0.0;
        }
        grad_00 = (REF_DBL *)malloc(__size);
        if (grad_00 == (REF_DBL *)0x0) {
          pcVar20 = "malloc gradx of REF_DBL NULL";
          uVar17 = 0x180;
        }
        else {
          for (lVar12 = 0; lVar14 != lVar12; lVar12 = lVar12 + 1) {
            grad_00[lVar12] = 0.0;
          }
          grad_01 = (REF_DBL *)malloc(__size);
          if (grad_01 == (REF_DBL *)0x0) {
            pcVar20 = "malloc grady of REF_DBL NULL";
            uVar17 = 0x181;
          }
          else {
            for (lVar12 = 0; lVar14 != lVar12; lVar12 = lVar12 + 1) {
              grad_01[lVar12] = 0.0;
            }
            grad_02 = (REF_DBL *)malloc(__size);
            if (grad_02 != (REF_DBL *)0x0) {
              for (lVar12 = 0; lVar14 != lVar12; lVar12 = lVar12 + 1) {
                grad_02[lVar12] = 0.0;
              }
              uVar11 = ref_recon_l2_projection_grad(ref_grid,scalar,grad);
              if ((uVar11 & 0xfffffffb) == 0) {
                uVar13 = 0;
                pRVar16 = grad;
                uVar15 = (ulong)(uint)pRVar6->max;
                if (pRVar6->max < 1) {
                  uVar15 = uVar13;
                }
                for (; uVar15 != uVar13; uVar13 = uVar13 + 1) {
                  if (-1 < pRVar6->global[uVar13]) {
                    scalar_00[uVar13] = *pRVar16;
                  }
                  pRVar16 = pRVar16 + 3;
                }
                uVar11 = ref_recon_l2_projection_grad(ref_grid,scalar_00,grad_00);
                if ((uVar11 & 0xfffffffb) == 0) {
                  pRVar16 = grad + 1;
                  uVar13 = 0;
                  uVar15 = (ulong)(uint)pRVar6->max;
                  if (pRVar6->max < 1) {
                    uVar15 = uVar13;
                  }
                  for (; uVar15 != uVar13; uVar13 = uVar13 + 1) {
                    if (-1 < pRVar6->global[uVar13]) {
                      scalar_00[uVar13] = *pRVar16;
                    }
                    pRVar16 = pRVar16 + 3;
                  }
                  uVar11 = ref_recon_l2_projection_grad(ref_grid,scalar_00,grad_01);
                  if ((uVar11 & 0xfffffffb) == 0) {
                    pRVar16 = grad + 2;
                    uVar13 = 0;
                    uVar15 = (ulong)(uint)pRVar6->max;
                    if (pRVar6->max < 1) {
                      uVar15 = uVar13;
                    }
                    for (; uVar15 != uVar13; uVar13 = uVar13 + 1) {
                      if (-1 < pRVar6->global[uVar13]) {
                        scalar_00[uVar13] = *pRVar16;
                      }
                      pRVar16 = pRVar16 + 3;
                    }
                    uVar11 = ref_recon_l2_projection_grad(ref_grid,scalar_00,grad_02);
                    if ((uVar11 & 0xfffffffb) == 0) {
                      lVar14 = 0;
                      uVar11 = pRVar6->max;
                      if (pRVar6->max < 1) {
                        uVar11 = 0;
                      }
                      for (lVar12 = 0; (ulong)uVar11 * 0x18 - lVar12 != 0; lVar12 = lVar12 + 0x18) {
                        if (-1 < *(long *)((long)pRVar6->global + lVar14)) {
                          *(undefined8 *)((long)hessian + lVar12 * 2) =
                               *(undefined8 *)((long)grad_00 + lVar12);
                          pdVar2 = (double *)((long)grad_00 + lVar12 + 8);
                          dVar10 = pdVar2[1];
                          dVar4 = *(double *)((long)grad_02 + lVar12);
                          pdVar3 = (double *)((long)hessian + lVar12 * 2 + 8);
                          *pdVar3 = (*(double *)((long)grad_01 + lVar12) + *pdVar2) * 0.5;
                          pdVar3[1] = (dVar4 + dVar10) * 0.5;
                          *(undefined8 *)((long)hessian + lVar12 * 2 + 0x18) =
                               *(undefined8 *)((long)grad_01 + lVar12 + 8);
                          *(double *)((long)hessian + lVar12 * 2 + 0x20) =
                               (*(double *)((long)grad_01 + lVar12 + 0x10) +
                               *(double *)((long)grad_02 + lVar12 + 8)) * 0.5;
                          *(undefined8 *)((long)hessian + lVar12 * 2 + 0x28) =
                               *(undefined8 *)((long)grad_02 + lVar12 + 0x10);
                        }
                        lVar14 = lVar14 + 8;
                      }
                      free(grad_02);
                      free(grad_01);
                      free(grad_00);
                      free(scalar_00);
                      free(grad);
                      pRVar6 = ref_grid->node;
                      uVar15 = (ulong)(uint)pRVar6->max;
                      if (pRVar6->max < 0) {
                        pcVar20 = "malloc replace of REF_BOOL negative";
                        uVar17 = 0x58c;
                        goto LAB_001e2eea;
                      }
                      replace = (REF_BOOL *)malloc(uVar15 * 0x18);
                      if (replace == (REF_BOOL *)0x0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                               ,0x58c,"ref_recon_signed_hessian","malloc replace of REF_BOOL NULL");
                        return 2;
                      }
                      if (ref_grid->twod == 0) {
                        ref_recon_mask_tri(ref_grid,replace,6);
                      }
                      else {
                        pRVar7 = ref_grid->cell[0];
                        pRVar18 = replace;
                        for (uVar13 = 0; uVar13 < uVar15; uVar13 = uVar13 + 1) {
                          if (-1 < pRVar6->global[uVar13]) {
                            pRVar8 = pRVar7->ref_adj;
                            for (lVar14 = 0; lVar14 != 6; lVar14 = lVar14 + 1) {
                              uVar11 = 0;
                              if ((long)uVar13 < (long)pRVar8->nnode) {
                                uVar11 = (uint)(pRVar8->first[uVar13] != -1);
                              }
                              pRVar18[lVar14] = uVar11;
                            }
                          }
                          pRVar18 = pRVar18 + 6;
                        }
                      }
                      __ptr = malloc(uVar15 * 0x18);
                      if (__ptr == (void *)0x0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                               ,0x56b,"ref_recon_skip_orphan_replace",
                               "malloc contributions of REF_INT NULL");
                        uStack_70 = 2;
                      }
                      else {
                        for (lVar14 = 0; uVar15 * 6 - lVar14 != 0; lVar14 = lVar14 + 1) {
                          *(undefined4 *)((long)__ptr + lVar14 * 4) = 0;
                        }
                        uVar11 = ref_edge_create(&local_38,ref_grid);
                        if (uVar11 == 0) {
                          uVar13 = 0;
                          uVar15 = (ulong)(uint)local_38->n;
                          if (local_38->n < 1) {
                            uVar15 = uVar13;
                          }
                          for (; uVar13 != uVar15; uVar13 = uVar13 + 1) {
                            lVar14 = (long)(local_38->e2n[uVar13 * 2 + 1] * 6);
                            lVar12 = (long)(local_38->e2n[uVar13 * 2] * 6);
                            for (lVar21 = 0; lVar21 != 6; lVar21 = lVar21 + 1) {
                              if (replace[lVar12 + lVar21] == 0) {
                                lVar9 = lVar14;
                                if (replace[lVar14 + lVar21] != 0) goto LAB_001e3523;
                              }
                              else {
                                lVar9 = lVar12;
                                if (replace[lVar14 + lVar21] == 0) {
LAB_001e3523:
                                  piVar1 = (int *)((long)__ptr + (lVar21 + lVar9) * 4);
                                  *piVar1 = *piVar1 + 1;
                                }
                              }
                            }
                          }
                          uVar11 = ref_edge_free(local_38);
                          if (uVar11 == 0) {
                            iVar5 = pRVar6->max;
                            pvVar19 = __ptr;
                            pRVar18 = replace;
                            for (lVar14 = 0; lVar14 < iVar5; lVar14 = lVar14 + 1) {
                              if (-1 < pRVar6->global[lVar14]) {
                                for (lVar12 = 0; lVar12 != 6; lVar12 = lVar12 + 1) {
                                  if (*(int *)((long)pvVar19 + lVar12 * 4) == 0) {
                                    pRVar18[lVar12] = 0;
                                  }
                                }
                              }
                              pRVar18 = pRVar18 + 6;
                              pvVar19 = (void *)((long)pvVar19 + 0x18);
                            }
                            free(__ptr);
                            uVar11 = ref_recon_extrapolate_zeroth(ref_grid,hessian,replace,6);
                            if (uVar11 == 0) {
                              free(replace);
                              return 0;
                            }
                            uStack_70 = (ulong)uVar11;
                            pcVar20 = "bound extrap";
                            uVar17 = 0x594;
                            goto LAB_001e30f2;
                          }
                          pcVar20 = "free edge";
                          uVar17 = 0x579;
                        }
                        else {
                          pcVar20 = "edges";
                          uVar17 = 0x56c;
                        }
                        uStack_70 = (ulong)uVar11;
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                               ,uVar17,"ref_recon_skip_orphan_replace",uStack_70,pcVar20);
                      }
                      pcVar20 = "skip orphans";
                      uVar17 = 0x592;
                      goto LAB_001e30f2;
                    }
                    uStack_70 = (ulong)uVar11;
                    pcVar20 = "gradz";
                    uVar17 = 0x194;
                  }
                  else {
                    uStack_70 = (ulong)uVar11;
                    pcVar20 = "grady";
                    uVar17 = 399;
                  }
                }
                else {
                  uStack_70 = (ulong)uVar11;
                  pcVar20 = "gradx";
                  uVar17 = 0x18a;
                }
              }
              else {
                uStack_70 = (ulong)uVar11;
                pcVar20 = "l2 grad";
                uVar17 = 0x185;
              }
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,uVar17,"ref_recon_l2_projection_hessian",uStack_70,pcVar20);
              goto LAB_001e30d1;
            }
            pcVar20 = "malloc gradz of REF_DBL NULL";
            uVar17 = 0x182;
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar17,
           "ref_recon_l2_projection_hessian",pcVar20);
    uStack_70 = 2;
  }
LAB_001e30d1:
  pcVar20 = "l2";
  uVar17 = 0x58b;
LAB_001e30f2:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar17,
         "ref_recon_signed_hessian",uStack_70,pcVar20);
  return (REF_STATUS)uStack_70;
}

Assistant:

REF_FCN REF_STATUS ref_recon_signed_hessian(REF_GRID ref_grid, REF_DBL *scalar,
                                            REF_DBL *hessian,
                                            REF_RECON_RECONSTRUCTION recon) {
  REF_BOOL *replace;

  switch (recon) {
    case REF_RECON_L2PROJECTION:
      RSS(ref_recon_l2_projection_hessian(ref_grid, scalar, hessian), "l2");
      ref_malloc(replace, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_BOOL);
      if (ref_grid_twod(ref_grid)) {
        RSS(ref_recon_mask_edg(ref_grid, replace, 6), "mask edg");
      } else {
        RSS(ref_recon_mask_tri(ref_grid, replace, 6), "mask tri");
      }
      RSS(ref_recon_skip_orphan_replace(ref_grid, replace, 6), "skip orphans");
      RSS(ref_recon_extrapolate_zeroth(ref_grid, hessian, replace, 6),
          "bound extrap");
      ref_free(replace);
      break;
    case REF_RECON_KEXACT:
      RSS(ref_recon_kexact_gradient_hessian(ref_grid, scalar, NULL, hessian),
          "k-exact");
      break;
    case REF_RECON_LAST:
    default:
      THROW("reconstruction not available");
  }

  return REF_SUCCESS;
}